

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_OneLeak_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_OneLeak_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_OneLeak_Test *this_00;
  TEST_MemoryLeakDetectorTest_OneLeak_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_OneLeak_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x84);
  TEST_MemoryLeakDetectorTest_OneLeak_Test::TEST_MemoryLeakDetectorTest_OneLeak_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 3);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    STRCMP_CONTAINS("Memory leak(s) found", output.asCharString());
    STRCMP_CONTAINS("size: 3", output.asCharString());
    STRCMP_CONTAINS("alloc", output.asCharString());
    STRCMP_CONTAINS(StringFromFormat("%p", (void*) mem).asCharString(), output.asCharString());
    STRCMP_CONTAINS("Total number of leaks", output.asCharString());
    PlatformSpecificFree(mem);
    LONGS_EQUAL(1, testAllocator->alloc_called);
    LONGS_EQUAL(0, testAllocator->free_called);
}